

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder * __thiscall
capnp::DynamicStruct::Builder::get(Builder *__return_storage_ptr__,Builder *this,Field field)

{
  int *__return_storage_ptr___00;
  double dVar1;
  Builder value;
  PointerBuilder builder;
  Builder value_00;
  ListBuilder builder_00;
  ListBuilder builder_01;
  StructBuilder builder_02;
  StructBuilder builder_03;
  Builder value_01;
  Builder value_02;
  Builder value_03;
  Builder value_04;
  ListSchema schema;
  ListSchema schema_00;
  Type TVar2;
  bool bVar3;
  int8_t value_05;
  char cVar4;
  uint8_t value_06;
  uchar uVar5;
  ElementSize elementSize;
  Which WVar6;
  Which WVar7;
  int16_t value_07;
  short sVar8;
  uint16_t value_08;
  unsigned_short uVar9;
  int32_t value_09;
  int iVar10;
  uint uVar11;
  StructDataOffset SVar12;
  uint32_t uVar13;
  StructPointerOffset SVar14;
  int64_t value_10;
  long lVar15;
  uint64_t uVar16;
  char *defaultValue;
  uchar *defaultValue_00;
  size_t sVar17;
  unsigned_long uVar18;
  float fVar19;
  Builder value_11;
  DynamicEnum value_12;
  word *local_630;
  word *local_620;
  word *local_608;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  Schema local_4b0;
  Builder local_4a8;
  PointerBuilder local_478;
  PointerBuilder local_460;
  Client local_448;
  PointerBuilder local_430;
  Builder local_418;
  Reader local_400;
  Schema local_3e0;
  StructSize local_3d4;
  PointerBuilder local_3d0;
  StructBuilder local_3b8;
  Schema local_390;
  Builder local_388;
  Schema local_358;
  StructSchema structSchema;
  PointerBuilder local_330;
  ListBuilder local_318;
  Type local_2f0;
  Builder local_2e0;
  Reader local_2a8;
  Schema local_288;
  StructSize local_27c;
  PointerBuilder local_278;
  ListBuilder local_260;
  Type local_238;
  Builder local_228;
  undefined1 local_1f0 [8];
  ListSchema listType;
  undefined1 local_1b8 [8];
  Reader typedDval_2;
  Builder local_190;
  undefined1 local_178 [8];
  Reader typedDval_1;
  DynamicEnum local_160;
  uint16_t local_14c;
  undefined1 local_148 [4];
  uint16_t typedDval;
  Reader dval;
  Reader slot;
  Type type;
  Reader proto;
  Fault local_58;
  Fault f;
  StructSchema local_48;
  undefined1 local_40 [8];
  DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> _kjCondition;
  Builder *this_local;
  
  _kjCondition._32_8_ = this;
  f.exception = (Exception *)StructSchema::Field::getContainingStruct(&field);
  local_48.super_Schema.raw =
       (Schema)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StructSchema *)&f);
  kj::_::DebugExpression<capnp::StructSchema>::operator==
            ((DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)local_40,
             (DebugExpression<capnp::StructSchema> *)&local_48,&this->schema);
  bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar3) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema&>&,char_const(&)[39]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x10a,FAILED,"field.getContainingStruct() == schema",
               "_kjCondition,\"`field` is not a field of this struct.\"",
               (DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)local_40,
               (char (*) [39])"`field` is not a field of this struct.");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  verifySetInUnion(this,field);
  StructSchema::Field::getProto((Reader *)&type.field_4,&field);
  join_0x00000010_0x00000000_ = StructSchema::Field::getType(&field);
  WVar6 = capnp::schema::Field::Reader::which((Reader *)&type.field_4);
  if (WVar6 == SLOT) {
    __return_storage_ptr___00 = &dval._reader.nestingLimit;
    capnp::schema::Field::Reader::getSlot
              ((Reader *)__return_storage_ptr___00,(Reader *)&type.field_4);
    capnp::schema::Field::Slot::Reader::getDefaultValue
              ((Reader *)local_148,(Reader *)__return_storage_ptr___00);
    WVar7 = capnp::Type::which((Type *)&slot._reader.nestingLimit);
    switch(WVar7) {
    case VOID:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      capnp::_::StructBuilder::getDataField<capnp::Void>(&this->builder,SVar12);
      DynamicValue::Builder::Builder(__return_storage_ptr__);
      break;
    case BOOL:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      bVar3 = capnp::schema::Value::Reader::getBool((Reader *)local_148);
      bVar3 = capnp::(anonymous_namespace)::bitCast<bool,bool>(bVar3);
      bVar3 = capnp::_::StructBuilder::getDataField<bool>(&this->builder,SVar12,bVar3);
      DynamicValue::Builder::Builder(__return_storage_ptr__,bVar3);
      break;
    case INT8:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      value_05 = capnp::schema::Value::Reader::getInt8((Reader *)local_148);
      cVar4 = capnp::(anonymous_namespace)::bitCast<signed_char,signed_char>(value_05);
      cVar4 = capnp::_::StructBuilder::getDataField<signed_char>(&this->builder,SVar12,cVar4);
      DynamicValue::Builder::Builder(__return_storage_ptr__,cVar4);
      break;
    case INT16:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      value_07 = capnp::schema::Value::Reader::getInt16((Reader *)local_148);
      sVar8 = capnp::(anonymous_namespace)::bitCast<short,short>(value_07);
      sVar8 = capnp::_::StructBuilder::getDataField<short>(&this->builder,SVar12,sVar8);
      DynamicValue::Builder::Builder(__return_storage_ptr__,sVar8);
      break;
    case INT32:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      value_09 = capnp::schema::Value::Reader::getInt32((Reader *)local_148);
      iVar10 = capnp::(anonymous_namespace)::bitCast<int,int>(value_09);
      iVar10 = capnp::_::StructBuilder::getDataField<int>(&this->builder,SVar12,iVar10);
      DynamicValue::Builder::Builder(__return_storage_ptr__,iVar10);
      break;
    case INT64:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      value_10 = capnp::schema::Value::Reader::getInt64((Reader *)local_148);
      lVar15 = capnp::(anonymous_namespace)::bitCast<long,long>(value_10);
      lVar15 = capnp::_::StructBuilder::getDataField<long>(&this->builder,SVar12,lVar15);
      DynamicValue::Builder::Builder(__return_storage_ptr__,lVar15);
      break;
    case UINT8:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      value_06 = capnp::schema::Value::Reader::getUint8((Reader *)local_148);
      uVar5 = capnp::(anonymous_namespace)::bitCast<unsigned_char,unsigned_char>(value_06);
      uVar5 = capnp::_::StructBuilder::getDataField<unsigned_char>(&this->builder,SVar12,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,uVar5);
      break;
    case UINT16:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      value_08 = capnp::schema::Value::Reader::getUint16((Reader *)local_148);
      uVar9 = capnp::(anonymous_namespace)::bitCast<unsigned_short,unsigned_short>(value_08);
      uVar9 = capnp::_::StructBuilder::getDataField<unsigned_short>(&this->builder,SVar12,uVar9);
      DynamicValue::Builder::Builder(__return_storage_ptr__,uVar9);
      break;
    case UINT32:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      uVar13 = capnp::schema::Value::Reader::getUint32((Reader *)local_148);
      uVar11 = capnp::(anonymous_namespace)::bitCast<unsigned_int,unsigned_int>(uVar13);
      uVar11 = capnp::_::StructBuilder::getDataField<unsigned_int>(&this->builder,SVar12,uVar11);
      DynamicValue::Builder::Builder(__return_storage_ptr__,uVar11);
      break;
    case UINT64:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      uVar16 = capnp::schema::Value::Reader::getUint64((Reader *)local_148);
      uVar18 = capnp::(anonymous_namespace)::bitCast<unsigned_long,unsigned_long>(uVar16);
      uVar18 = capnp::_::StructBuilder::getDataField<unsigned_long>(&this->builder,SVar12,uVar18);
      DynamicValue::Builder::Builder(__return_storage_ptr__,uVar18);
      break;
    case FLOAT32:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      fVar19 = capnp::schema::Value::Reader::getFloat32((Reader *)local_148);
      uVar13 = capnp::(anonymous_namespace)::bitCast<unsigned_int,float>(fVar19);
      fVar19 = capnp::_::StructBuilder::getDataField<float>(&this->builder,SVar12,uVar13);
      DynamicValue::Builder::Builder(__return_storage_ptr__,fVar19);
      break;
    case FLOAT64:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      dVar1 = capnp::schema::Value::Reader::getFloat64((Reader *)local_148);
      uVar16 = capnp::(anonymous_namespace)::bitCast<unsigned_long,double>(dVar1);
      dVar1 = capnp::_::StructBuilder::getDataField<double>(&this->builder,SVar12,uVar16);
      DynamicValue::Builder::Builder(__return_storage_ptr__,dVar1);
      break;
    case TEXT:
      bVar3 = capnp::schema::Value::Reader::isAnyPointer((Reader *)local_148);
      if (bVar3) {
        memset(local_178,0,0x10);
        Text::Reader::Reader((Reader *)local_178);
      }
      else {
        _local_178 = (ArrayPtr<const_char>)
                     capnp::schema::Value::Reader::getText((Reader *)local_148);
      }
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar14 = assumePointerOffset(uVar13);
      capnp::_::StructBuilder::getPointerField
                ((PointerBuilder *)&typedDval_2.super_ArrayPtr<const_unsigned_char>.size_,
                 &this->builder,SVar14);
      defaultValue = kj::StringPtr::begin((StringPtr *)local_178);
      sVar17 = kj::StringPtr::size((StringPtr *)local_178);
      uVar18 = assumeMax<536870910ul,unsigned_long>(sVar17);
      capnp::_::PointerBuilder::getBlob<capnp::Text>
                (&local_190,(PointerBuilder *)&typedDval_2.super_ArrayPtr<const_unsigned_char>.size_
                 ,defaultValue,(ByteCount)uVar18);
      value.content.ptr = local_190.content.ptr;
      value._0_8_ = local_190._0_8_;
      value.content.size_ = local_190.content.size_;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value);
      break;
    case DATA:
      bVar3 = capnp::schema::Value::Reader::isAnyPointer((Reader *)local_148);
      if (bVar3) {
        memset(local_1b8,0,0x10);
        Data::Reader::Reader((Reader *)local_1b8);
      }
      else {
        _local_1b8 = (ArrayPtr<const_unsigned_char>)
                     capnp::schema::Value::Reader::getData((Reader *)local_148);
      }
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar14 = assumePointerOffset(uVar13);
      capnp::_::StructBuilder::getPointerField
                ((PointerBuilder *)&listType.elementType.field_4,&this->builder,SVar14);
      defaultValue_00 =
           kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)local_1b8);
      sVar17 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)local_1b8);
      uVar18 = assumeBits<29u,unsigned_long>(sVar17);
      value_11 = capnp::_::PointerBuilder::getBlob<capnp::Data>
                           ((PointerBuilder *)&listType.elementType.field_4,defaultValue_00,
                            (ByteCount)uVar18);
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_11);
      break;
    case LIST:
      _local_1f0 = (Type)capnp::Type::asList((Type *)&slot._reader.nestingLimit);
      WVar7 = ListSchema::whichElementType((ListSchema *)local_1f0);
      TVar2 = _local_1f0;
      _local_1f0 = TVar2;
      if (WVar7 == STRUCT) {
        local_238.baseType = local_1f0._0_2_;
        local_238.listDepth = local_1f0[2];
        local_238.isImplicitParam = (bool)local_1f0[3];
        local_238.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_1f0._4_2_;
        local_238._6_2_ = local_1f0._6_2_;
        local_238.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)listType.elementType._0_8_;
        uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit)
        ;
        SVar14 = assumePointerOffset(uVar13);
        capnp::_::StructBuilder::getPointerField(&local_278,&this->builder,SVar14);
        local_288.raw =
             (RawBrandedSchema *)ListSchema::getStructElementType((ListSchema *)local_1f0);
        local_27c = anon_unknown_70::structSizeFromSchema((StructSchema)local_288.raw);
        bVar3 = capnp::schema::Value::Reader::isAnyPointer((Reader *)local_148);
        if (bVar3) {
          local_608 = (word *)0x0;
        }
        else {
          capnp::schema::Value::Reader::getList(&local_2a8,(Reader *)local_148);
          local_608 = AnyPointer::Reader::getAs<capnp::_::UncheckedMessage>(&local_2a8);
        }
        capnp::_::PointerBuilder::getStructList(&local_260,&local_278,local_27c,local_608);
        schema_00.elementType.field_4.schema = local_238.field_4.schema;
        schema_00.elementType.baseType = local_238.baseType;
        schema_00.elementType.listDepth = local_238.listDepth;
        schema_00.elementType.isImplicitParam = local_238.isImplicitParam;
        schema_00.elementType.field_3 = local_238.field_3;
        schema_00.elementType._6_2_ = local_238._6_2_;
        builder_00.capTable = local_260.capTable;
        builder_00.segment = local_260.segment;
        builder_00.ptr = local_260.ptr;
        builder_00.elementCount = local_260.elementCount;
        builder_00.step = local_260.step;
        builder_00.structDataSize = local_260.structDataSize;
        builder_00.structPointerCount = local_260.structPointerCount;
        builder_00.elementSize = local_260.elementSize;
        builder_00._39_1_ = local_260._39_1_;
        DynamicList::Builder::Builder(&local_228,schema_00,builder_00);
        value_03.schema.elementType.field_4.schema = local_228.schema.elementType.field_4.schema;
        value_03.schema.elementType.baseType = local_228.schema.elementType.baseType;
        value_03.schema.elementType.listDepth = local_228.schema.elementType.listDepth;
        value_03.schema.elementType.isImplicitParam = local_228.schema.elementType.isImplicitParam;
        value_03.schema.elementType.field_3 = local_228.schema.elementType.field_3;
        value_03.schema.elementType._6_2_ = local_228.schema.elementType._6_2_;
        value_03.builder.segment = local_228.builder.segment;
        value_03.builder.capTable = local_228.builder.capTable;
        value_03.builder.ptr = local_228.builder.ptr;
        value_03.builder.elementCount = local_228.builder.elementCount;
        value_03.builder.step = local_228.builder.step;
        value_03.builder.structDataSize = local_228.builder.structDataSize;
        value_03.builder.structPointerCount = local_228.builder.structPointerCount;
        value_03.builder.elementSize = local_228.builder.elementSize;
        value_03.builder._39_1_ = local_228.builder._39_1_;
        DynamicValue::Builder::Builder(__return_storage_ptr__,value_03);
      }
      else {
        local_2f0.baseType = local_1f0._0_2_;
        local_2f0.listDepth = local_1f0[2];
        local_2f0.isImplicitParam = (bool)local_1f0[3];
        local_2f0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_1f0._4_2_;
        local_2f0._6_2_ = local_1f0._6_2_;
        local_2f0.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)listType.elementType._0_8_;
        uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit)
        ;
        SVar14 = assumePointerOffset(uVar13);
        capnp::_::StructBuilder::getPointerField(&local_330,&this->builder,SVar14);
        WVar7 = ListSchema::whichElementType((ListSchema *)local_1f0);
        elementSize = anon_unknown_70::elementSizeFor(WVar7);
        bVar3 = capnp::schema::Value::Reader::isAnyPointer((Reader *)local_148);
        if (bVar3) {
          local_620 = (word *)0x0;
        }
        else {
          capnp::schema::Value::Reader::getList((Reader *)&structSchema,(Reader *)local_148);
          local_620 = AnyPointer::Reader::getAs<capnp::_::UncheckedMessage>((Reader *)&structSchema)
          ;
        }
        capnp::_::PointerBuilder::getList(&local_318,&local_330,elementSize,local_620);
        schema.elementType.field_4.schema = local_2f0.field_4.schema;
        schema.elementType.baseType = local_2f0.baseType;
        schema.elementType.listDepth = local_2f0.listDepth;
        schema.elementType.isImplicitParam = local_2f0.isImplicitParam;
        schema.elementType.field_3 = local_2f0.field_3;
        schema.elementType._6_2_ = local_2f0._6_2_;
        builder_01.capTable = local_318.capTable;
        builder_01.segment = local_318.segment;
        builder_01.ptr = local_318.ptr;
        builder_01.elementCount = local_318.elementCount;
        builder_01.step = local_318.step;
        builder_01.structDataSize = local_318.structDataSize;
        builder_01.structPointerCount = local_318.structPointerCount;
        builder_01.elementSize = local_318.elementSize;
        builder_01._39_1_ = local_318._39_1_;
        DynamicList::Builder::Builder(&local_2e0,schema,builder_01);
        value_04.schema.elementType.field_4.schema = local_2e0.schema.elementType.field_4.schema;
        value_04.schema.elementType.baseType = local_2e0.schema.elementType.baseType;
        value_04.schema.elementType.listDepth = local_2e0.schema.elementType.listDepth;
        value_04.schema.elementType.isImplicitParam = local_2e0.schema.elementType.isImplicitParam;
        value_04.schema.elementType.field_3 = local_2e0.schema.elementType.field_3;
        value_04.schema.elementType._6_2_ = local_2e0.schema.elementType._6_2_;
        value_04.builder.segment = local_2e0.builder.segment;
        value_04.builder.capTable = local_2e0.builder.capTable;
        value_04.builder.ptr = local_2e0.builder.ptr;
        value_04.builder.elementCount = local_2e0.builder.elementCount;
        value_04.builder.step = local_2e0.builder.step;
        value_04.builder.structDataSize = local_2e0.builder.structDataSize;
        value_04.builder.structPointerCount = local_2e0.builder.structPointerCount;
        value_04.builder.elementSize = local_2e0.builder.elementSize;
        value_04.builder._39_1_ = local_2e0.builder._39_1_;
        DynamicValue::Builder::Builder(__return_storage_ptr__,value_04);
      }
      break;
    case ENUM:
      local_14c = capnp::schema::Value::Reader::getEnum((Reader *)local_148);
      typedDval_1.super_StringPtr.content.size_ =
           (size_t)capnp::Type::asEnum((Type *)&slot._reader.nestingLimit);
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar12 = assumeDataOffset(uVar13);
      uVar9 = capnp::_::StructBuilder::getDataField<unsigned_short>(&this->builder,SVar12,local_14c)
      ;
      DynamicEnum::DynamicEnum
                (&local_160,(EnumSchema)typedDval_1.super_StringPtr.content.size_,uVar9);
      value_12._10_6_ = 0;
      value_12.schema.super_Schema.raw = local_160.schema.super_Schema.raw;
      value_12.value = local_160.value;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_12);
      break;
    case STRUCT:
      local_390.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)&slot._reader.nestingLimit);
      local_358.raw = local_390.raw;
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar14 = assumePointerOffset(uVar13);
      capnp::_::StructBuilder::getPointerField(&local_3d0,&this->builder,SVar14);
      local_3e0.raw = local_358.raw;
      local_3d4 = anon_unknown_70::structSizeFromSchema((StructSchema)local_358.raw);
      bVar3 = capnp::schema::Value::Reader::isAnyPointer((Reader *)local_148);
      if (bVar3) {
        local_630 = (word *)0x0;
      }
      else {
        capnp::schema::Value::Reader::getStruct(&local_400,(Reader *)local_148);
        local_630 = AnyPointer::Reader::getAs<capnp::_::UncheckedMessage>(&local_400);
      }
      capnp::_::PointerBuilder::getStruct(&local_3b8,&local_3d0,local_3d4,local_630);
      builder_02.capTable = local_3b8.capTable;
      builder_02.segment = local_3b8.segment;
      builder_02.data = local_3b8.data;
      builder_02.pointers = local_3b8.pointers;
      builder_02.dataSize = local_3b8.dataSize;
      builder_02.pointerCount = local_3b8.pointerCount;
      builder_02._38_2_ = local_3b8._38_2_;
      Builder(&local_388,(StructSchema)local_390.raw,builder_02);
      value_01.builder.segment = local_388.builder.segment;
      value_01.schema.super_Schema.raw = local_388.schema.super_Schema.raw;
      value_01.builder.capTable = local_388.builder.capTable;
      value_01.builder.data = local_388.builder.data;
      value_01.builder.pointers = local_388.builder.pointers;
      value_01.builder.dataSize = local_388.builder.dataSize;
      value_01.builder.pointerCount = local_388.builder.pointerCount;
      value_01.builder._38_2_ = local_388.builder._38_2_;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_01);
      break;
    case INTERFACE:
      local_460.pointer =
           (WirePointer *)capnp::Type::asInterface((Type *)&slot._reader.nestingLimit);
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar14 = assumePointerOffset(uVar13);
      capnp::_::StructBuilder::getPointerField(&local_478,&this->builder,SVar14);
      capnp::_::PointerBuilder::getCapability(&local_460);
      DynamicCapability::Client::Client
                (&local_448,(InterfaceSchema)local_460.pointer,
                 (Own<capnp::ClientHook,_std::nullptr_t> *)&local_460);
      DynamicValue::Builder::Builder(__return_storage_ptr__,&local_448);
      DynamicCapability::Client::~Client(&local_448);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
                ((Own<capnp::ClientHook,_std::nullptr_t> *)&local_460);
      break;
    case ANY_POINTER:
      uVar13 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar14 = assumePointerOffset(uVar13);
      capnp::_::StructBuilder::getPointerField(&local_430,&this->builder,SVar14);
      builder.capTable = local_430.capTable;
      builder.segment = local_430.segment;
      builder.pointer = local_430.pointer;
      AnyPointer::Builder::Builder(&local_418,builder);
      value_00.builder.capTable = local_418.builder.capTable;
      value_00.builder.segment = local_418.builder.segment;
      value_00.builder.pointer = local_418.builder.pointer;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_00);
      break;
    default:
      kj::_::unreachable();
    }
  }
  else {
    if (WVar6 != GROUP) {
      kj::_::unreachable();
    }
    local_4b0.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)&slot._reader.nestingLimit);
    memcpy(&local_4d8,&this->builder,0x28);
    builder_03.capTable = (CapTableBuilder *)uStack_4d0;
    builder_03.segment = (SegmentBuilder *)local_4d8;
    builder_03.data = (void *)local_4c8;
    builder_03.pointers = (WirePointer *)uStack_4c0;
    builder_03.dataSize = (undefined4)local_4b8;
    builder_03.pointerCount = local_4b8._4_2_;
    builder_03._38_2_ = local_4b8._6_2_;
    Builder(&local_4a8,(StructSchema)local_4b0.raw,builder_03);
    value_02.builder.segment = local_4a8.builder.segment;
    value_02.schema.super_Schema.raw = local_4a8.schema.super_Schema.raw;
    value_02.builder.capTable = local_4a8.builder.capTable;
    value_02.builder.data = local_4a8.builder.data;
    value_02.builder.pointers = local_4a8.builder.pointers;
    value_02.builder.dataSize = local_4a8.builder.dataSize;
    value_02.builder.pointerCount = local_4a8.builder.pointerCount;
    value_02.builder._38_2_ = local_4a8.builder._38_2_;
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_02);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder DynamicStruct::Builder::get(StructSchema::Field field) {
  KJ_REQUIRE(field.getContainingStruct() == schema, "`field` is not a field of this struct.");
  verifySetInUnion(field);

  auto proto = field.getProto();
  auto type = field.getType();
  switch (proto.which()) {
    case schema::Field::SLOT: {
      auto slot = proto.getSlot();

      // Note that the default value might be "anyPointer" even if the type is some pointer type
      // *other than* anyPointer. This happens with generics -- the field is actually a generic
      // parameter that has been bound, but the default value was of course compiled without any
      // binding available.
      auto dval = slot.getDefaultValue();

      switch (type.which()) {
        case schema::Type::VOID:
          return builder.getDataField<Void>(assumeDataOffset(slot.getOffset()));

#define HANDLE_TYPE(discrim, titleCase, type) \
        case schema::Type::discrim: \
          return builder.getDataField<type>( \
              assumeDataOffset(slot.getOffset()), \
              bitCast<_::Mask<type>>(dval.get##titleCase()));

        HANDLE_TYPE(BOOL, Bool, bool)
        HANDLE_TYPE(INT8, Int8, int8_t)
        HANDLE_TYPE(INT16, Int16, int16_t)
        HANDLE_TYPE(INT32, Int32, int32_t)
        HANDLE_TYPE(INT64, Int64, int64_t)
        HANDLE_TYPE(UINT8, Uint8, uint8_t)
        HANDLE_TYPE(UINT16, Uint16, uint16_t)
        HANDLE_TYPE(UINT32, Uint32, uint32_t)
        HANDLE_TYPE(UINT64, Uint64, uint64_t)
        HANDLE_TYPE(FLOAT32, Float32, float)
        HANDLE_TYPE(FLOAT64, Float64, double)

#undef HANDLE_TYPE

        case schema::Type::ENUM: {
          uint16_t typedDval = dval.getEnum();
          return DynamicEnum(type.asEnum(),
              builder.getDataField<uint16_t>(assumeDataOffset(slot.getOffset()), typedDval));
        }

        case schema::Type::TEXT: {
          Text::Reader typedDval = dval.isAnyPointer() ? Text::Reader() : dval.getText();
          return builder.getPointerField(assumePointerOffset(slot.getOffset()))
                        .getBlob<Text>(typedDval.begin(),
                            assumeMax<MAX_TEXT_SIZE>(typedDval.size()) * BYTES);
        }

        case schema::Type::DATA: {
          Data::Reader typedDval = dval.isAnyPointer() ? Data::Reader() : dval.getData();
          return builder.getPointerField(assumePointerOffset(slot.getOffset()))
                        .getBlob<Data>(typedDval.begin(),
                            assumeBits<BLOB_SIZE_BITS>(typedDval.size()) * BYTES);
        }

        case schema::Type::LIST: {
          ListSchema listType = type.asList();
          if (listType.whichElementType() == schema::Type::STRUCT) {
            return DynamicList::Builder(listType,
                builder.getPointerField(assumePointerOffset(slot.getOffset()))
                       .getStructList(structSizeFromSchema(listType.getStructElementType()),
                                      dval.isAnyPointer() ? nullptr :
                                          dval.getList().getAs<_::UncheckedMessage>()));
          } else {
            return DynamicList::Builder(listType,
                builder.getPointerField(assumePointerOffset(slot.getOffset()))
                       .getList(elementSizeFor(listType.whichElementType()),
                                dval.isAnyPointer() ? nullptr :
                                    dval.getList().getAs<_::UncheckedMessage>()));
          }
        }

        case schema::Type::STRUCT: {
          auto structSchema = type.asStruct();
          return DynamicStruct::Builder(structSchema,
              builder.getPointerField(assumePointerOffset(slot.getOffset()))
                     .getStruct(structSizeFromSchema(structSchema),
                                dval.isAnyPointer() ? nullptr :
                                    dval.getStruct().getAs<_::UncheckedMessage>()));
        }

        case schema::Type::ANY_POINTER:
          return AnyPointer::Builder(
              builder.getPointerField(assumePointerOffset(slot.getOffset())));

        case schema::Type::INTERFACE:
          return DynamicCapability::Client(type.asInterface(),
              builder.getPointerField(assumePointerOffset(slot.getOffset())).getCapability());
      }

      KJ_UNREACHABLE;
    }

    case schema::Field::GROUP:
      return DynamicStruct::Builder(type.asStruct(), builder);
  }

  KJ_UNREACHABLE;
}